

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double insphereslow(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double b;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  double b_00;
  double b_01;
  double b_02;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double b_03;
  double b_04;
  double b_05;
  double b_06;
  double dVar25;
  double dVar26;
  double dVar27;
  double b_07;
  double b_08;
  double b_09;
  double b_10;
  double b_11;
  double dVar28;
  double dVar29;
  double dVar30;
  double b_12;
  double dVar31;
  double dVar32;
  double dVar33;
  double b_13;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double b_14;
  double b_15;
  double b_16;
  double b_17;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double b_18;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double b_19;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double b_20;
  double dVar65;
  double b_21;
  double dVar66;
  double dVar67;
  double dStack_d5458;
  double dStack_d5408;
  undefined4 uStack_d53d8;
  undefined4 uStack_d53d4;
  double dStack_d5358;
  double dStack_d5340;
  double dStack_d5330;
  double dStack_d5328;
  double dStack_d5200;
  double ac [16];
  double da [16];
  double bc [16];
  double ab [16];
  double temp64b [64];
  double temp64a [64];
  double temp32b [32];
  double temp32a [32];
  double bd [16];
  double cd [16];
  double dStack_d4738;
  double dStack_d4730;
  double dStack_d4728;
  double dStack_d4720;
  double dStack_d4718;
  double dStack_d4710;
  double dStack_d4708;
  double dStack_d4700;
  double dStack_d46f8;
  double dStack_d46f0;
  double dStack_d46e8;
  double dStack_d46e0;
  double dStack_d46d8;
  double dStack_d46d0;
  double dStack_d46c8;
  double dStack_d46c0;
  double dStack_d46b8;
  double dStack_d46b0;
  double dStack_d46a8;
  double dStack_d46a0;
  double dStack_d4698;
  double dStack_d4690;
  double dStack_d4688;
  double dStack_d4680;
  double dStack_d4678;
  double dStack_d4670;
  double dStack_d4668;
  double dStack_d4660;
  double dStack_d4658;
  double dStack_d4650;
  double dStack_d4648;
  double dStack_d4640;
  double dStack_d4638;
  double dStack_d4630;
  double dStack_d4628;
  double dStack_d4620;
  double dStack_d4618;
  double dStack_d4610;
  double dStack_d4608;
  double dStack_d4600;
  double dStack_d45f8;
  double dStack_d45f0;
  double dStack_d45e8;
  double dStack_d45e0;
  double dStack_d45d8;
  double dStack_d45d0;
  double dStack_d45c8;
  double dStack_d45c0;
  double dStack_d45b8;
  double dStack_d45b0;
  double dStack_d45a8;
  double dStack_d45a0;
  double dStack_d4598;
  double dStack_d4590;
  double dStack_d4588;
  double dStack_d4580;
  double dStack_d4578;
  double dStack_d4570;
  double dStack_d4568;
  double dStack_d4560;
  double dStack_d4558;
  double dStack_d4550;
  double dStack_d4548;
  double dStack_d4540;
  double dStack_d4538;
  double dStack_d4530;
  double dStack_d4528;
  double dStack_d4520;
  double dStack_d4518;
  undefined1 auStack_d4510 [16];
  double dStack_d4500;
  double dStack_d44f8;
  double dStack_d44f0;
  double dStack_d44e8;
  double dStack_d44e0;
  double dStack_d44d8;
  double dStack_d44d0;
  double dStack_d44c8;
  double dStack_d44c0;
  double dStack_d44b8;
  double dStack_d44b0;
  double dStack_d44a8;
  double dStack_d44a0;
  double dStack_d4498;
  double dStack_d4490;
  double dStack_d4488;
  double dStack_d4480;
  double dStack_d4478;
  double dStack_d4470;
  double dStack_d4468;
  double dStack_d4460;
  double dStack_d4458;
  double dStack_d4450;
  double dStack_d4448;
  double dStack_d4440;
  double temp192 [192];
  double temp64c [64];
  double temp128 [128];
  double detzzt [768];
  double detzt [384];
  double detyyt [768];
  double detyt [384];
  double detxxt [768];
  double detxt [384];
  double detzz [768];
  double detz [384];
  double detyy [768];
  double dety [384];
  double detxx [768];
  double detx [384];
  double detztzt [768];
  double detytyt [768];
  double detxtxt [768];
  double y2 [2304];
  double x2 [2304];
  double z1 [1536];
  double y1 [1536];
  double x1 [1536];
  double z2 [2304];
  double detxy [4608];
  double cdet [6912];
  double bdet [6912];
  double adet [6912];
  double ddet [6912];
  double deter [27648];
  double cddet [13824];
  double abdet [13824];
  
  dVar26 = splitter;
  dVar22 = *pa;
  dVar1 = pa[2];
  dVar2 = pe[2];
  b = dVar1 - dVar2;
  dVar23 = *pb;
  dVar21 = pb[2];
  b_00 = dVar21 - dVar2;
  b_03 = (dVar21 - (b_00 + (dVar21 - b_00))) + ((dVar21 - b_00) - dVar2);
  dVar21 = pc[2];
  b_01 = dVar21 - dVar2;
  b_04 = (dVar21 - (b_01 + (dVar21 - b_01))) + ((dVar21 - b_01) - dVar2);
  dVar21 = pd[2];
  b_02 = dVar21 - dVar2;
  b_05 = (dVar21 - (b_02 + (dVar21 - b_02))) + ((dVar21 - b_02) - dVar2);
  dVar21 = *pe;
  dVar24 = pe[1];
  b_07 = dVar22 - dVar21;
  b_13 = (dVar22 - (b_07 + (dVar22 - b_07))) + ((dVar22 - b_07) - dVar21);
  b_21 = dVar23 - dVar21;
  b_20 = (dVar23 - (b_21 + (dVar23 - b_21))) + ((dVar23 - b_21) - dVar21);
  dVar22 = pb[1];
  b_14 = dVar22 - dVar24;
  b_19 = (dVar22 - (b_14 + (dVar22 - b_14))) + ((dVar22 - b_14) - dVar24);
  dVar22 = *pc;
  b_08 = dVar22 - dVar21;
  uStack_d53d8 = SUB84(b_08,0);
  uStack_d53d4 = (undefined4)((ulong)b_08 >> 0x20);
  b_15 = (dVar22 - (b_08 + (dVar22 - b_08))) + ((dVar22 - b_08) - dVar21);
  dVar22 = pc[1];
  b_09 = dVar22 - dVar24;
  b_16 = (dVar22 - (b_09 + (dVar22 - b_09))) + ((dVar22 - b_09) - dVar24);
  dVar22 = pa[1];
  dVar23 = *pd;
  b_10 = dVar22 - dVar24;
  b_12 = dVar23 - dVar21;
  b_17 = (dVar22 - (b_10 + (dVar22 - b_10))) + ((dVar22 - b_10) - dVar24);
  b_18 = (dVar23 - (b_12 + (dVar23 - b_12))) + ((dVar23 - b_12) - dVar21);
  dVar22 = pd[1];
  b_06 = dVar22 - dVar24;
  b_11 = (dVar22 - (b_06 + (dVar22 - b_06))) + ((dVar22 - b_06) - dVar24);
  dVar19 = b_13 * splitter - (b_13 * splitter - b_13);
  dVar20 = b_07 * splitter - (b_07 * splitter - b_07);
  dVar25 = b_19 * splitter - (b_19 * splitter - b_19);
  dVar27 = b_14 * splitter - (b_14 * splitter - b_14);
  dVar21 = b_13 * b_19;
  dVar24 = b_13 * b_14;
  dVar28 = b_13 - dVar19;
  dVar29 = b_19 - dVar25;
  dVar31 = b_14 - dVar27;
  dStack_d4478 = dVar28 * dVar29 -
                 (((dVar21 - dVar19 * dVar25) - dVar28 * dVar25) - dVar19 * dVar29);
  dVar58 = b_07 - dVar20;
  auVar3._8_4_ = SUB84(b_07,0);
  auVar3._0_8_ = b_07;
  auVar3._12_4_ = (int)((ulong)b_07 >> 0x20);
  dVar22 = b_07 * b_19;
  dVar23 = b_07 * b_14;
  dVar59 = dVar58 * dVar29 - (((dVar22 - dVar20 * dVar25) - dVar58 * dVar25) - dVar20 * dVar29);
  dVar63 = dVar58 * dVar31 - (((dVar23 - dVar20 * dVar27) - dVar58 * dVar27) - dVar20 * dVar31);
  dVar29 = dVar21 + dVar59;
  dVar36 = dVar24 + dVar63;
  dVar37 = dVar22 + dVar29;
  dVar46 = dVar29 - (dVar37 - dVar22);
  dVar25 = dVar31 * dVar28 - (((dVar24 - dVar19 * dVar27) - dVar27 * dVar28) - dVar19 * dVar31);
  dVar22 = (dVar21 - (dVar29 - (dVar29 - dVar21))) + (dVar59 - (dVar29 - dVar21));
  dVar21 = (dVar24 - (dVar36 - (dVar36 - dVar24))) + (dVar63 - (dVar36 - dVar24));
  dVar27 = dVar25 + dVar22;
  dVar29 = dVar46 + dVar27;
  dVar31 = (dVar46 - (dVar29 - (dVar29 - dVar46))) + (dVar27 - (dVar29 - dVar46));
  dVar24 = dVar37 + dVar29;
  dVar29 = (dVar37 - (dVar24 - (dVar24 - dVar37))) + (dVar29 - (dVar24 - dVar37));
  dVar37 = dVar21 + dVar31;
  dStack_d4470 = (dVar25 - (dVar27 - dVar22)) + (dVar22 - (dVar27 - (dVar27 - dVar22)));
  dStack_d4468 = (dVar31 - (dVar37 - (dVar37 - dVar31))) + (dVar21 - (dVar37 - dVar31));
  dVar27 = dVar23 + dVar36;
  dVar25 = dVar29 + dVar37;
  dVar21 = dVar24 + dVar25;
  dVar24 = (dVar24 - (dVar21 - (dVar21 - dVar24))) + (dVar25 - (dVar21 - dVar24));
  dVar22 = (dVar23 - (dVar27 - (dVar27 - dVar23))) + (dVar36 - (dVar27 - dVar23));
  dVar23 = (dVar29 - (dVar25 - (dVar25 - dVar29))) + (dVar37 - (dVar25 - dVar29));
  dVar31 = dVar23 + dVar22;
  dVar25 = dVar24 + dVar31;
  dVar24 = (dVar24 - (dVar25 - (dVar25 - dVar24))) + (dVar31 - (dVar25 - dVar24));
  dVar29 = dVar21 + dVar25;
  dVar21 = (dVar21 - (dVar29 - (dVar29 - dVar21))) + (dVar25 - (dVar29 - dVar21));
  dVar25 = dVar24 + dVar27;
  dStack_d4460 = (dVar23 - (dVar31 - (dVar31 - dVar23))) + (dVar22 - (dVar31 - dVar23));
  dStack_d4458 = (dVar24 - (dVar25 - (dVar25 - dVar24))) + (dVar27 - (dVar25 - dVar24));
  dVar22 = dVar21 + dVar25;
  dStack_d4440 = dVar29 + dVar22;
  dStack_d4450 = (dVar21 - (dVar22 - (dVar22 - dVar21))) + (dVar25 - (dVar22 - dVar21));
  dStack_d4448 = (dVar29 - (dStack_d4440 - (dStack_d4440 - dVar29))) +
                 (dVar22 - (dStack_d4440 - dVar29));
  dVar36 = b_20 * splitter - (b_20 * splitter - b_20);
  dVar37 = b_21 * splitter - (b_21 * splitter - b_21);
  dVar22 = -b_17;
  dVar29 = -b_10;
  dVar66 = splitter * dVar22 - (b_17 + splitter * dVar22);
  dVar67 = splitter * dVar29 - (b_10 + splitter * dVar29);
  dVar24 = b_20 * dVar22;
  dVar25 = b_20 * dVar29;
  dVar65 = b_20 - dVar36;
  dVar47 = dVar22 - dVar66;
  dVar53 = dVar29 - dVar67;
  dStack_d45f8 = dVar65 * dVar47 -
                 (((dVar24 - dVar36 * dVar66) - dVar65 * dVar66) - dVar36 * dVar47);
  dVar34 = b_21 - dVar37;
  auVar4._8_4_ = SUB84(b_21,0);
  auVar4._0_8_ = b_21;
  auVar4._12_4_ = (int)((ulong)b_21 >> 0x20);
  dVar23 = b_21 * dVar22;
  dVar21 = b_21 * dVar29;
  dVar48 = dVar34 * dVar47 - (((dVar23 - dVar37 * dVar66) - dVar34 * dVar66) - dVar37 * dVar47);
  dVar54 = dVar34 * dVar53 - (((dVar21 - dVar37 * dVar67) - dVar34 * dVar67) - dVar37 * dVar53);
  dVar31 = dVar24 + dVar48;
  dVar46 = dVar25 + dVar54;
  dVar59 = dVar23 + dVar31;
  dVar27 = dVar31 - (dVar59 - dVar23);
  dVar63 = dVar65 * dVar53 - (((dVar25 - dVar36 * dVar67) - dVar65 * dVar67) - dVar36 * dVar53);
  dVar23 = (dVar24 - (dVar31 - (dVar31 - dVar24))) + (dVar48 - (dVar31 - dVar24));
  dVar24 = (dVar25 - (dVar46 - (dVar46 - dVar25))) + (dVar54 - (dVar46 - dVar25));
  dVar31 = dVar63 + dVar23;
  dVar54 = dVar27 + dVar31;
  dVar48 = (dVar27 - (dVar54 - (dVar54 - dVar27))) + (dVar31 - (dVar54 - dVar27));
  dVar25 = dVar59 + dVar54;
  dVar27 = (dVar59 - (dVar25 - (dVar25 - dVar59))) + (dVar54 - (dVar25 - dVar59));
  dVar54 = dVar24 + dVar48;
  dStack_d45f0 = (dVar63 - (dVar31 - dVar23)) + (dVar23 - (dVar31 - (dVar31 - dVar23)));
  dStack_d45e8 = (dVar48 - (dVar54 - (dVar54 - dVar48))) + (dVar24 - (dVar54 - dVar48));
  dVar59 = dVar21 + dVar46;
  dVar31 = dVar27 + dVar54;
  dVar24 = dVar25 + dVar31;
  dVar25 = (dVar25 - (dVar24 - (dVar24 - dVar25))) + (dVar31 - (dVar24 - dVar25));
  dVar23 = (dVar21 - (dVar59 - (dVar59 - dVar21))) + (dVar46 - (dVar59 - dVar21));
  dVar21 = (dVar27 - (dVar31 - (dVar31 - dVar27))) + (dVar54 - (dVar31 - dVar27));
  dVar46 = dVar21 + dVar23;
  dVar27 = dVar25 + dVar46;
  dVar25 = (dVar25 - (dVar27 - (dVar27 - dVar25))) + (dVar46 - (dVar27 - dVar25));
  dVar31 = dVar24 + dVar27;
  dVar24 = (dVar24 - (dVar31 - (dVar31 - dVar24))) + (dVar27 - (dVar31 - dVar24));
  dVar27 = dVar25 + dVar59;
  dStack_d45e0 = (dVar21 - (dVar46 - (dVar46 - dVar21))) + (dVar23 - (dVar46 - dVar21));
  dStack_d45d8 = (dVar25 - (dVar27 - (dVar27 - dVar25))) + (dVar59 - (dVar27 - dVar25));
  dVar23 = dVar24 + dVar27;
  dStack_d45c0 = dVar31 + dVar23;
  dStack_d45d0 = (dVar24 - (dVar23 - (dVar23 - dVar24))) + (dVar27 - (dVar23 - dVar24));
  dStack_d45c8 = (dVar31 - (dStack_d45c0 - (dStack_d45c0 - dVar31))) +
                 (dVar23 - (dStack_d45c0 - dVar31));
  iVar6 = fast_expansion_sum_zeroelim(8,&dStack_d4478,8,&dStack_d45f8,ab);
  dVar38 = dVar26 * b_16 - (dVar26 * b_16 - b_16);
  dVar43 = dVar26 * b_09 - (dVar26 * b_09 - b_09);
  dVar24 = b_20 * b_16;
  dVar25 = b_20 * b_09;
  dVar49 = b_16 - dVar38;
  dVar55 = b_09 - dVar43;
  dStack_d44b8 = dVar65 * dVar49 -
                 (((dVar24 - dVar36 * dVar38) - dVar65 * dVar38) - dVar36 * dVar49);
  dStack_d5330 = auVar4._8_8_;
  dVar23 = b_21 * b_16;
  dVar21 = dStack_d5330 * b_09;
  dVar48 = dVar34 * dVar49 - (((dVar23 - dVar37 * dVar38) - dVar34 * dVar38) - dVar37 * dVar49);
  dVar54 = dVar34 * dVar55 - (((dVar21 - dVar37 * dVar43) - dVar34 * dVar43) - dVar37 * dVar55);
  dVar31 = dVar24 + dVar48;
  dVar46 = dVar25 + dVar54;
  dVar59 = dVar23 + dVar31;
  dVar27 = dVar31 - (dVar59 - dVar23);
  dVar63 = dVar65 * dVar55 - (((dVar25 - dVar36 * dVar43) - dVar65 * dVar43) - dVar36 * dVar55);
  dVar23 = (dVar24 - (dVar31 - (dVar31 - dVar24))) + (dVar48 - (dVar31 - dVar24));
  dVar24 = (dVar25 - (dVar46 - (dVar46 - dVar25))) + (dVar54 - (dVar46 - dVar25));
  dVar31 = dVar63 + dVar23;
  dVar54 = dVar27 + dVar31;
  dVar48 = (dVar27 - (dVar54 - (dVar54 - dVar27))) + (dVar31 - (dVar54 - dVar27));
  dVar25 = dVar59 + dVar54;
  dVar27 = (dVar59 - (dVar25 - (dVar25 - dVar59))) + (dVar54 - (dVar25 - dVar59));
  dVar54 = dVar24 + dVar48;
  dStack_d44b0 = (dVar63 - (dVar31 - dVar23)) + (dVar23 - (dVar31 - (dVar31 - dVar23)));
  dStack_d44a8 = (dVar48 - (dVar54 - (dVar54 - dVar48))) + (dVar24 - (dVar54 - dVar48));
  dVar59 = dVar21 + dVar46;
  dVar31 = dVar27 + dVar54;
  dVar24 = dVar25 + dVar31;
  dVar25 = (dVar25 - (dVar24 - (dVar24 - dVar25))) + (dVar31 - (dVar24 - dVar25));
  dVar23 = (dVar21 - (dVar59 - (dVar59 - dVar21))) + (dVar46 - (dVar59 - dVar21));
  dVar21 = (dVar27 - (dVar31 - (dVar31 - dVar27))) + (dVar54 - (dVar31 - dVar27));
  dVar46 = dVar21 + dVar23;
  dVar27 = dVar25 + dVar46;
  dVar25 = (dVar25 - (dVar27 - (dVar27 - dVar25))) + (dVar46 - (dVar27 - dVar25));
  dVar31 = dVar24 + dVar27;
  dVar24 = (dVar24 - (dVar31 - (dVar31 - dVar24))) + (dVar27 - (dVar31 - dVar24));
  dVar27 = dVar25 + dVar59;
  dStack_d44a0 = (dVar21 - (dVar46 - (dVar46 - dVar21))) + (dVar23 - (dVar46 - dVar21));
  dStack_d4498 = (dVar25 - (dVar27 - (dVar27 - dVar25))) + (dVar59 - (dVar27 - dVar25));
  dVar23 = dVar24 + dVar27;
  dStack_d4480 = dVar31 + dVar23;
  dStack_d4490 = (dVar24 - (dVar23 - (dVar23 - dVar24))) + (dVar27 - (dVar23 - dVar24));
  dStack_d4488 = (dVar31 - (dStack_d4480 - (dStack_d4480 - dVar31))) +
                 (dVar23 - (dStack_d4480 - dVar31));
  dVar46 = b_15 * dVar26 - (b_15 * dVar26 - b_15);
  dVar23 = b_15 - dVar46;
  dVar59 = b_08 * dVar26 - (b_08 * dVar26 - b_08);
  dVar60 = b_08 - dVar59;
  dVar21 = -b_19;
  dVar31 = -b_14;
  dVar30 = dVar26 * dVar21 - (dVar26 * dVar21 + b_19);
  dVar32 = dVar26 * dVar31 - (b_14 + dVar26 * dVar31);
  dVar27 = b_15 * dVar21;
  dVar63 = b_15 * dVar31;
  dVar39 = dVar21 - dVar30;
  dVar44 = dVar31 - dVar32;
  dStack_d4638 = dVar23 * dVar39 -
                 (((dVar27 - dVar46 * dVar30) - dVar23 * dVar30) - dVar46 * dVar39);
  auVar5._8_4_ = uStack_d53d8;
  auVar5._0_8_ = b_08;
  auVar5._12_4_ = uStack_d53d4;
  dVar24 = b_08 * dVar21;
  dVar25 = b_08 * dVar31;
  dVar50 = dVar60 * dVar39 - (((dVar24 - dVar59 * dVar30) - dVar60 * dVar30) - dVar59 * dVar39);
  dVar56 = dVar60 * dVar44 - (((dVar25 - dVar59 * dVar32) - dVar60 * dVar32) - dVar59 * dVar44);
  dVar54 = dVar27 + dVar50;
  dVar33 = dVar63 + dVar56;
  dVar35 = dVar24 + dVar54;
  dVar48 = dVar54 - (dVar35 - dVar24);
  dVar40 = dVar23 * dVar44 - (((dVar63 - dVar46 * dVar32) - dVar23 * dVar32) - dVar46 * dVar44);
  dVar24 = (dVar27 - (dVar54 - (dVar54 - dVar27))) + (dVar50 - (dVar54 - dVar27));
  dVar27 = (dVar63 - (dVar33 - (dVar33 - dVar63))) + (dVar56 - (dVar33 - dVar63));
  dVar54 = dVar40 + dVar24;
  dVar56 = dVar48 + dVar54;
  dVar50 = (dVar48 - (dVar56 - (dVar56 - dVar48))) + (dVar54 - (dVar56 - dVar48));
  dVar63 = dVar35 + dVar56;
  dVar48 = (dVar35 - (dVar63 - (dVar63 - dVar35))) + (dVar56 - (dVar63 - dVar35));
  dVar56 = dVar27 + dVar50;
  dStack_d4630 = (dVar40 - (dVar54 - dVar24)) + (dVar24 - (dVar54 - (dVar54 - dVar24)));
  dStack_d4628 = (dVar50 - (dVar56 - (dVar56 - dVar50))) + (dVar27 - (dVar56 - dVar50));
  dVar35 = dVar25 + dVar33;
  dVar54 = dVar48 + dVar56;
  dVar27 = dVar63 + dVar54;
  dVar63 = (dVar63 - (dVar27 - (dVar27 - dVar63))) + (dVar54 - (dVar27 - dVar63));
  dVar24 = (dVar25 - (dVar35 - (dVar35 - dVar25))) + (dVar33 - (dVar35 - dVar25));
  dVar25 = (dVar48 - (dVar54 - (dVar54 - dVar48))) + (dVar56 - (dVar54 - dVar48));
  dVar33 = dVar25 + dVar24;
  dVar48 = dVar63 + dVar33;
  dVar63 = (dVar63 - (dVar48 - (dVar48 - dVar63))) + (dVar33 - (dVar48 - dVar63));
  dVar54 = dVar27 + dVar48;
  dVar27 = (dVar27 - (dVar54 - (dVar54 - dVar27))) + (dVar48 - (dVar54 - dVar27));
  dVar48 = dVar63 + dVar35;
  dStack_d4620 = (dVar25 - (dVar33 - (dVar33 - dVar25))) + (dVar24 - (dVar33 - dVar25));
  dStack_d4618 = (dVar63 - (dVar48 - (dVar48 - dVar63))) + (dVar35 - (dVar48 - dVar63));
  dVar24 = dVar27 + dVar48;
  dStack_d4600 = dVar54 + dVar24;
  dStack_d4610 = (dVar27 - (dVar24 - (dVar24 - dVar27))) + (dVar48 - (dVar24 - dVar27));
  dStack_d4608 = (dVar54 - (dStack_d4600 - (dStack_d4600 - dVar54))) +
                 (dVar24 - (dStack_d4600 - dVar54));
  iVar7 = fast_expansion_sum_zeroelim(8,&dStack_d44b8,8,&dStack_d4638,bc);
  dVar41 = dVar26 * b_11 - (dVar26 * b_11 - b_11);
  dVar45 = dVar26 * b_06 - (dVar26 * b_06 - b_06);
  dVar27 = b_15 * b_11;
  dVar63 = b_15 * b_06;
  dVar51 = b_11 - dVar41;
  dVar57 = b_06 - dVar45;
  dStack_d44f8 = dVar23 * dVar51 -
                 (((dVar27 - dVar46 * dVar41) - dVar23 * dVar41) - dVar46 * dVar51);
  dStack_d5200 = auVar5._8_8_;
  dVar24 = b_08 * b_11;
  dVar25 = dStack_d5200 * b_06;
  dVar50 = dVar60 * dVar51 - (((dVar24 - dVar59 * dVar41) - dVar60 * dVar41) - dVar59 * dVar51);
  dVar56 = dVar60 * dVar57 - (((dVar25 - dVar59 * dVar45) - dVar60 * dVar45) - dVar59 * dVar57);
  dVar54 = dVar27 + dVar50;
  dVar33 = dVar63 + dVar56;
  dVar35 = dVar24 + dVar54;
  dVar48 = dVar54 - (dVar35 - dVar24);
  dVar40 = dVar23 * dVar57 - (((dVar63 - dVar46 * dVar45) - dVar23 * dVar45) - dVar46 * dVar57);
  dVar24 = (dVar27 - (dVar54 - (dVar54 - dVar27))) + (dVar50 - (dVar54 - dVar27));
  dVar27 = (dVar63 - (dVar33 - (dVar33 - dVar63))) + (dVar56 - (dVar33 - dVar63));
  dVar54 = dVar40 + dVar24;
  dVar56 = dVar48 + dVar54;
  dVar50 = (dVar48 - (dVar56 - (dVar56 - dVar48))) + (dVar54 - (dVar56 - dVar48));
  dVar63 = dVar35 + dVar56;
  dVar48 = (dVar35 - (dVar63 - (dVar63 - dVar35))) + (dVar56 - (dVar63 - dVar35));
  dVar56 = dVar27 + dVar50;
  dStack_d44f0 = (dVar40 - (dVar54 - dVar24)) + (dVar24 - (dVar54 - (dVar54 - dVar24)));
  dStack_d44e8 = (dVar50 - (dVar56 - (dVar56 - dVar50))) + (dVar27 - (dVar56 - dVar50));
  dVar35 = dVar25 + dVar33;
  dVar54 = dVar48 + dVar56;
  dVar27 = dVar63 + dVar54;
  dVar63 = (dVar63 - (dVar27 - (dVar27 - dVar63))) + (dVar54 - (dVar27 - dVar63));
  dVar24 = (dVar25 - (dVar35 - (dVar35 - dVar25))) + (dVar33 - (dVar35 - dVar25));
  dVar25 = (dVar48 - (dVar54 - (dVar54 - dVar48))) + (dVar56 - (dVar54 - dVar48));
  dVar33 = dVar25 + dVar24;
  dVar48 = dVar63 + dVar33;
  dVar63 = (dVar63 - (dVar48 - (dVar48 - dVar63))) + (dVar33 - (dVar48 - dVar63));
  dVar54 = dVar27 + dVar48;
  dVar27 = (dVar27 - (dVar54 - (dVar54 - dVar27))) + (dVar48 - (dVar54 - dVar27));
  dVar48 = dVar63 + dVar35;
  dStack_d44e0 = (dVar25 - (dVar33 - (dVar33 - dVar25))) + (dVar24 - (dVar33 - dVar25));
  dStack_d44d8 = (dVar63 - (dVar48 - (dVar48 - dVar63))) + (dVar35 - (dVar48 - dVar63));
  dVar24 = dVar27 + dVar48;
  dStack_d44c0 = dVar54 + dVar24;
  dStack_d44d0 = (dVar27 - (dVar24 - (dVar24 - dVar27))) + (dVar48 - (dVar24 - dVar27));
  dStack_d44c8 = (dVar54 - (dStack_d44c0 - (dStack_d44c0 - dVar54))) +
                 (dVar24 - (dStack_d44c0 - dVar54));
  dVar33 = dVar26 * b_18 - (dVar26 * b_18 - b_18);
  dVar24 = b_18 - dVar33;
  dVar63 = dVar26 * b_12 - (dVar26 * b_12 - b_12);
  dVar61 = b_12 - dVar63;
  dVar48 = -b_16;
  dVar54 = -b_09;
  dVar50 = dVar26 * dVar48 - (dVar26 * dVar48 + b_16);
  dVar56 = dVar26 * dVar54 - (b_09 + dVar26 * dVar54);
  dVar35 = b_18 * dVar48;
  dVar40 = b_18 * dVar54;
  dVar25 = b_12 * dVar48;
  dVar27 = b_12 * dVar54;
  dVar48 = dVar48 - dVar50;
  dVar54 = dVar54 - dVar56;
  dStack_d4678 = dVar24 * dVar48 -
                 (((dVar35 - dVar33 * dVar50) - dVar24 * dVar50) - dVar33 * dVar48);
  dVar62 = dVar61 * dVar48 - (((dVar25 - dVar63 * dVar50) - dVar61 * dVar50) - dVar63 * dVar48);
  dVar64 = dVar61 * dVar54 - (((dVar27 - dVar63 * dVar56) - dVar61 * dVar56) - dVar63 * dVar54);
  dVar48 = dVar35 + dVar62;
  dVar50 = dVar40 + dVar64;
  dVar42 = dVar25 + dVar48;
  dVar52 = dVar48 - (dVar42 - dVar25);
  dVar25 = dVar54 * dVar24 - (((dVar40 - dVar33 * dVar56) - dVar56 * dVar24) - dVar33 * dVar54);
  dVar48 = (dVar35 - (dVar48 - (dVar48 - dVar35))) + (dVar62 - (dVar48 - dVar35));
  dVar54 = (dVar40 - (dVar50 - (dVar50 - dVar40))) + (dVar64 - (dVar50 - dVar40));
  dVar35 = dVar25 + dVar48;
  dVar56 = dVar52 + dVar35;
  dVar52 = (dVar52 - (dVar56 - (dVar56 - dVar52))) + (dVar35 - (dVar56 - dVar52));
  dVar40 = dVar42 + dVar56;
  dVar56 = (dVar42 - (dVar40 - (dVar40 - dVar42))) + (dVar56 - (dVar40 - dVar42));
  dVar42 = dVar54 + dVar52;
  dStack_d4670 = (dVar25 - (dVar35 - dVar48)) + (dVar48 - (dVar35 - (dVar35 - dVar48)));
  dStack_d4668 = (dVar52 - (dVar42 - (dVar42 - dVar52))) + (dVar54 - (dVar42 - dVar52));
  dVar54 = dVar27 + dVar50;
  dVar35 = dVar56 + dVar42;
  dVar48 = dVar40 + dVar35;
  dVar40 = (dVar40 - (dVar48 - (dVar48 - dVar40))) + (dVar35 - (dVar48 - dVar40));
  dVar25 = (dVar27 - (dVar54 - (dVar54 - dVar27))) + (dVar50 - (dVar54 - dVar27));
  dVar27 = (dVar56 - (dVar35 - (dVar35 - dVar56))) + (dVar42 - (dVar35 - dVar56));
  dVar56 = dVar27 + dVar25;
  dVar42 = dVar40 + dVar56;
  dVar35 = (dVar40 - (dVar42 - (dVar42 - dVar40))) + (dVar56 - (dVar42 - dVar40));
  dVar50 = dVar48 + dVar42;
  dVar48 = (dVar48 - (dVar50 - (dVar50 - dVar48))) + (dVar42 - (dVar50 - dVar48));
  dVar40 = dVar35 + dVar54;
  dStack_d4660 = (dVar27 - (dVar56 - (dVar56 - dVar27))) + (dVar25 - (dVar56 - dVar27));
  dStack_d4658 = (dVar35 - (dVar40 - (dVar40 - dVar35))) + (dVar54 - (dVar40 - dVar35));
  dVar25 = dVar48 + dVar40;
  dStack_d4640 = dVar50 + dVar25;
  dStack_d4650 = (dVar48 - (dVar25 - (dVar25 - dVar48))) + (dVar40 - (dVar25 - dVar48));
  dStack_d4648 = (dVar50 - (dStack_d4640 - (dStack_d4640 - dVar50))) +
                 (dVar25 - (dStack_d4640 - dVar50));
  iVar8 = fast_expansion_sum_zeroelim(8,&dStack_d44f8,8,&dStack_d4678,cd);
  dVar48 = b_17 * dVar26 - (b_17 * dVar26 - b_17);
  dVar54 = b_10 * dVar26 - (b_10 * dVar26 - b_10);
  dVar25 = b_18 * b_17;
  dVar27 = b_10 * b_18;
  dVar35 = b_17 - dVar48;
  dVar40 = b_10 - dVar54;
  dStack_d4538 = dVar24 * dVar35 -
                 (((dVar25 - dVar33 * dVar48) - dVar24 * dVar48) - dVar33 * dVar35);
  dVar56 = b_17 * b_12;
  dVar62 = b_10 * b_12;
  dVar42 = dVar61 * dVar35 - (((dVar56 - dVar63 * dVar48) - dVar61 * dVar48) - dVar63 * dVar35);
  dVar52 = dVar61 * dVar40 - (((dVar62 - dVar63 * dVar54) - dVar61 * dVar54) - dVar63 * dVar40);
  dVar48 = dVar25 + dVar42;
  dVar35 = dVar27 + dVar52;
  dVar50 = dVar56 + dVar48;
  dVar56 = dVar48 - (dVar50 - dVar56);
  dVar54 = dVar40 * dVar24 - (((dVar27 - dVar33 * dVar54) - dVar54 * dVar24) - dVar33 * dVar40);
  dVar25 = (dVar25 - (dVar48 - (dVar48 - dVar25))) + (dVar42 - (dVar48 - dVar25));
  dVar27 = (dVar27 - (dVar35 - (dVar35 - dVar27))) + (dVar52 - (dVar35 - dVar27));
  dVar40 = dVar54 + dVar25;
  dVar42 = dVar56 + dVar40;
  dVar56 = (dVar56 - (dVar42 - (dVar42 - dVar56))) + (dVar40 - (dVar42 - dVar56));
  dVar48 = dVar50 + dVar42;
  dVar50 = (dVar50 - (dVar48 - (dVar48 - dVar50))) + (dVar42 - (dVar48 - dVar50));
  dVar42 = dVar27 + dVar56;
  dStack_d4530 = (dVar54 - (dVar40 - dVar25)) + (dVar25 - (dVar40 - (dVar40 - dVar25)));
  dStack_d4528 = (dVar56 - (dVar42 - (dVar42 - dVar56))) + (dVar27 - (dVar42 - dVar56));
  dVar40 = dVar62 + dVar35;
  dVar54 = dVar50 + dVar42;
  dVar25 = dVar48 + dVar54;
  dVar27 = (dVar48 - (dVar25 - (dVar25 - dVar48))) + (dVar54 - (dVar25 - dVar48));
  dVar56 = (dVar62 - (dVar40 - (dVar40 - dVar62))) + (dVar35 - (dVar40 - dVar62));
  dVar50 = (dVar50 - (dVar54 - (dVar54 - dVar50))) + (dVar42 - (dVar54 - dVar50));
  dVar35 = dVar50 + dVar56;
  dVar48 = dVar27 + dVar35;
  dVar27 = (dVar27 - (dVar48 - (dVar48 - dVar27))) + (dVar35 - (dVar48 - dVar27));
  dVar54 = dVar25 + dVar48;
  dVar25 = (dVar25 - (dVar54 - (dVar54 - dVar25))) + (dVar48 - (dVar54 - dVar25));
  dVar48 = dVar27 + dVar40;
  dStack_d4520 = (dVar50 - (dVar35 - (dVar35 - dVar50))) + (dVar56 - (dVar35 - dVar50));
  dStack_d4518 = (dVar27 - (dVar48 - (dVar48 - dVar27))) + (dVar40 - (dVar48 - dVar27));
  dVar35 = dVar25 + dVar48;
  dStack_d4500 = dVar54 + dVar35;
  dVar27 = (dVar54 - (dStack_d4500 - (dStack_d4500 - dVar54))) + (dVar35 - (dStack_d4500 - dVar54));
  auStack_d4510._8_4_ = SUB84(dVar27,0);
  auStack_d4510._0_8_ = (dVar25 - (dVar35 - (dVar35 - dVar25))) + (dVar48 - (dVar35 - dVar25));
  auStack_d4510._12_4_ = (int)((ulong)dVar27 >> 0x20);
  dVar48 = -b_11;
  dVar54 = -b_06;
  dVar40 = dVar26 * dVar48 - (dVar26 * dVar48 + b_11);
  dVar50 = dVar26 * dVar54 - (b_06 + dVar26 * dVar54);
  dVar26 = b_13 * dVar48;
  dVar35 = b_13 * dVar54;
  dStack_d5340 = auVar3._8_8_;
  dVar25 = b_07 * dVar48;
  dVar27 = dStack_d5340 * dVar54;
  dVar48 = dVar48 - dVar40;
  dVar54 = dVar54 - dVar50;
  dStack_d46b8 = dVar28 * dVar48 -
                 (((dVar26 - dVar19 * dVar40) - dVar28 * dVar40) - dVar19 * dVar48);
  dVar52 = dVar58 * dVar48 - (((dVar25 - dVar20 * dVar40) - dVar58 * dVar40) - dVar20 * dVar48);
  dVar62 = dVar58 * dVar54 - (((dVar27 - dVar20 * dVar50) - dVar58 * dVar50) - dVar20 * dVar54);
  dVar48 = dVar26 + dVar52;
  dVar56 = dVar35 + dVar62;
  dVar42 = dVar25 + dVar48;
  dVar40 = dVar48 - (dVar42 - dVar25);
  dVar25 = dVar54 * dVar28 - (((dVar35 - dVar19 * dVar50) - dVar50 * dVar28) - dVar19 * dVar54);
  dVar26 = (dVar26 - (dVar48 - (dVar48 - dVar26))) + (dVar52 - (dVar48 - dVar26));
  dVar48 = (dVar35 - (dVar56 - (dVar56 - dVar35))) + (dVar62 - (dVar56 - dVar35));
  dVar54 = dVar25 + dVar26;
  dVar52 = dVar40 + dVar54;
  dVar50 = (dVar40 - (dVar52 - (dVar52 - dVar40))) + (dVar54 - (dVar52 - dVar40));
  dVar35 = dVar42 + dVar52;
  dVar40 = (dVar42 - (dVar35 - (dVar35 - dVar42))) + (dVar52 - (dVar35 - dVar42));
  dVar42 = dVar48 + dVar50;
  dStack_d46b0 = (dVar25 - (dVar54 - dVar26)) + (dVar26 - (dVar54 - (dVar54 - dVar26)));
  dStack_d46a8 = (dVar50 - (dVar42 - (dVar42 - dVar50))) + (dVar48 - (dVar42 - dVar50));
  dVar48 = dVar27 + dVar56;
  dVar54 = dVar40 + dVar42;
  dVar26 = dVar35 + dVar54;
  dVar35 = (dVar35 - (dVar26 - (dVar26 - dVar35))) + (dVar54 - (dVar26 - dVar35));
  dVar25 = (dVar27 - (dVar48 - (dVar48 - dVar27))) + (dVar56 - (dVar48 - dVar27));
  dVar27 = (dVar40 - (dVar54 - (dVar54 - dVar40))) + (dVar42 - (dVar54 - dVar40));
  dVar50 = dVar27 + dVar25;
  dVar56 = dVar35 + dVar50;
  dVar54 = (dVar35 - (dVar56 - (dVar56 - dVar35))) + (dVar50 - (dVar56 - dVar35));
  dVar40 = dVar26 + dVar56;
  dVar26 = (dVar26 - (dVar40 - (dVar40 - dVar26))) + (dVar56 - (dVar40 - dVar26));
  dVar35 = dVar54 + dVar48;
  dStack_d46a0 = (dVar27 - (dVar50 - (dVar50 - dVar27))) + (dVar25 - (dVar50 - dVar27));
  dStack_d4698 = (dVar54 - (dVar35 - (dVar35 - dVar54))) + (dVar48 - (dVar35 - dVar54));
  dVar25 = dVar26 + dVar35;
  dStack_d4680 = dVar40 + dVar25;
  dStack_d4690 = (dVar26 - (dVar25 - (dVar25 - dVar26))) + (dVar35 - (dVar25 - dVar26));
  dStack_d4688 = (dVar40 - (dStack_d4680 - (dStack_d4680 - dVar40))) +
                 (dVar25 - (dStack_d4680 - dVar40));
  iVar9 = fast_expansion_sum_zeroelim(8,&dStack_d4538,8,&dStack_d46b8,da);
  dVar35 = b_13 * b_16;
  dVar40 = b_13 * b_09;
  dStack_d4578 = dVar28 * dVar49 -
                 (((dVar35 - dVar19 * dVar38) - dVar28 * dVar38) - dVar19 * dVar49);
  dVar25 = b_16 * b_07;
  dStack_d5340 = b_09 * dStack_d5340;
  dVar48 = dVar49 * dVar58 - (((dVar25 - dVar20 * dVar38) - dVar38 * dVar58) - dVar20 * dVar49);
  dVar54 = dVar55 * dVar58 -
           (((dStack_d5340 - dVar20 * dVar43) - dVar43 * dVar58) - dVar20 * dVar55);
  dVar27 = dVar35 + dVar48;
  dVar26 = dVar40 + dVar54;
  dVar20 = dVar25 + dVar27;
  dVar25 = dVar27 - (dVar20 - dVar25);
  dVar28 = dVar55 * dVar28 - (((dVar40 - dVar19 * dVar43) - dVar43 * dVar28) - dVar19 * dVar55);
  dVar35 = (dVar35 - (dVar27 - (dVar27 - dVar35))) + (dVar48 - (dVar27 - dVar35));
  dVar40 = (dVar40 - (dVar26 - (dVar26 - dVar40))) + (dVar54 - (dVar26 - dVar40));
  dVar19 = dVar28 + dVar35;
  dVar27 = dVar25 + dVar19;
  dVar48 = (dVar25 - (dVar27 - (dVar27 - dVar25))) + (dVar19 - (dVar27 - dVar25));
  dVar25 = dVar20 + dVar27;
  dVar27 = (dVar20 - (dVar25 - (dVar25 - dVar20))) + (dVar27 - (dVar25 - dVar20));
  dVar54 = dVar40 + dVar48;
  dStack_d4570 = (dVar28 - (dVar19 - dVar35)) + (dVar35 - (dVar19 - (dVar19 - dVar35)));
  dStack_d4568 = (dVar48 - (dVar54 - (dVar54 - dVar48))) + (dVar40 - (dVar54 - dVar48));
  dVar20 = dStack_d5340 + dVar26;
  dVar48 = dVar27 + dVar54;
  dVar19 = dVar25 + dVar48;
  dVar25 = (dVar25 - (dVar19 - (dVar19 - dVar25))) + (dVar48 - (dVar19 - dVar25));
  dVar35 = (dStack_d5340 - (dVar20 - (dVar20 - dStack_d5340))) + (dVar26 - (dVar20 - dStack_d5340));
  dVar54 = (dVar27 - (dVar48 - (dVar48 - dVar27))) + (dVar54 - (dVar48 - dVar27));
  dVar48 = dVar54 + dVar35;
  dVar27 = dVar25 + dVar48;
  dVar25 = (dVar25 - (dVar27 - (dVar27 - dVar25))) + (dVar48 - (dVar27 - dVar25));
  dVar26 = dVar19 + dVar27;
  dVar19 = (dVar19 - (dVar26 - (dVar26 - dVar19))) + (dVar27 - (dVar26 - dVar19));
  dVar27 = dVar25 + dVar20;
  dStack_d4560 = (dVar54 - (dVar48 - (dVar48 - dVar54))) + (dVar35 - (dVar48 - dVar54));
  dStack_d4558 = (dVar25 - (dVar27 - (dVar27 - dVar25))) + (dVar20 - (dVar27 - dVar25));
  dVar25 = dVar19 + dVar27;
  dStack_d4540 = dVar26 + dVar25;
  dStack_d4550 = (dVar19 - (dVar25 - (dVar25 - dVar19))) + (dVar27 - (dVar25 - dVar19));
  dStack_d4548 = (dVar26 - (dStack_d4540 - (dStack_d4540 - dVar26))) +
                 (dVar25 - (dStack_d4540 - dVar26));
  dVar48 = b_15 * dVar22;
  dVar54 = b_15 * dVar29;
  dStack_d46f8 = dVar23 * dVar47 -
                 (((dVar48 - dVar46 * dVar66) - dVar23 * dVar66) - dVar46 * dVar47);
  dVar22 = b_08 * dVar22;
  dStack_d5200 = dStack_d5200 * dVar29;
  dVar26 = dVar60 * dVar47 - (((dVar22 - dVar59 * dVar66) - dVar66 * dVar60) - dVar59 * dVar47);
  dVar19 = dVar60 * dVar53 -
           (((dStack_d5200 - dVar59 * dVar67) - dVar67 * dVar60) - dVar59 * dVar53);
  dVar25 = dVar48 + dVar26;
  dVar27 = dVar54 + dVar19;
  dVar29 = dVar22 + dVar25;
  dVar22 = dVar25 - (dVar29 - dVar22);
  dVar20 = dVar23 * dVar53 - (((dVar54 - dVar46 * dVar67) - dVar67 * dVar23) - dVar46 * dVar53);
  dVar46 = (dVar48 - (dVar25 - (dVar25 - dVar48))) + (dVar26 - (dVar25 - dVar48));
  dVar59 = (dVar54 - (dVar27 - (dVar27 - dVar54))) + (dVar19 - (dVar27 - dVar54));
  dVar25 = dVar20 + dVar46;
  dVar23 = dVar22 + dVar25;
  dVar26 = (dVar22 - (dVar23 - (dVar23 - dVar22))) + (dVar25 - (dVar23 - dVar22));
  dVar22 = dVar29 + dVar23;
  dVar23 = (dVar29 - (dVar22 - (dVar22 - dVar29))) + (dVar23 - (dVar22 - dVar29));
  dVar19 = dVar59 + dVar26;
  dStack_d46f0 = (dVar20 - (dVar25 - dVar46)) + (dVar46 - (dVar25 - (dVar25 - dVar46)));
  dStack_d46e8 = (dVar26 - (dVar19 - (dVar19 - dVar26))) + (dVar59 - (dVar19 - dVar26));
  dVar26 = dStack_d5200 + dVar27;
  dVar25 = dVar23 + dVar19;
  dVar29 = dVar22 + dVar25;
  dVar22 = (dVar22 - (dVar29 - (dVar29 - dVar22))) + (dVar25 - (dVar29 - dVar22));
  dVar20 = (dStack_d5200 - (dVar26 - (dVar26 - dStack_d5200))) + (dVar27 - (dVar26 - dStack_d5200));
  dVar46 = (dVar23 - (dVar25 - (dVar25 - dVar23))) + (dVar19 - (dVar25 - dVar23));
  dVar19 = dVar46 + dVar20;
  dVar23 = dVar22 + dVar19;
  dVar22 = (dVar22 - (dVar23 - (dVar23 - dVar22))) + (dVar19 - (dVar23 - dVar22));
  dVar25 = dVar29 + dVar23;
  dVar27 = (dVar29 - (dVar25 - (dVar25 - dVar29))) + (dVar23 - (dVar25 - dVar29));
  dVar23 = dVar22 + dVar26;
  dStack_d46e0 = (dVar46 - (dVar19 - (dVar19 - dVar46))) + (dVar20 - (dVar19 - dVar46));
  dStack_d46d8 = (dVar22 - (dVar23 - (dVar23 - dVar22))) + (dVar26 - (dVar23 - dVar22));
  dVar22 = dVar27 + dVar23;
  dStack_d46c0 = dVar25 + dVar22;
  dStack_d46d0 = (dVar27 - (dVar22 - (dVar22 - dVar27))) + (dVar23 - (dVar22 - dVar27));
  dStack_d46c8 = (dVar25 - (dStack_d46c0 - (dStack_d46c0 - dVar25))) +
                 (dVar22 - (dStack_d46c0 - dVar25));
  iVar10 = fast_expansion_sum_zeroelim(8,&dStack_d4578,8,&dStack_d46f8,ac);
  dVar19 = b_20 * b_11;
  dVar46 = b_20 * b_06;
  dStack_d45b8 = dVar65 * dVar51 -
                 (((dVar19 - dVar36 * dVar41) - dVar65 * dVar41) - dVar36 * dVar51);
  dVar22 = b_11 * b_21;
  dStack_d5330 = b_06 * dStack_d5330;
  dVar29 = dVar51 * dVar34 - (((dVar22 - dVar37 * dVar41) - dVar41 * dVar34) - dVar37 * dVar51);
  dVar26 = dVar57 * dVar34 -
           (((dStack_d5330 - dVar37 * dVar45) - dVar45 * dVar34) - dVar37 * dVar57);
  dVar23 = dVar19 + dVar29;
  dVar25 = dVar46 + dVar26;
  dVar27 = dVar22 + dVar23;
  dVar22 = dVar23 - (dVar27 - dVar22);
  dVar37 = dVar57 * dVar65 - (((dVar46 - dVar36 * dVar45) - dVar45 * dVar65) - dVar36 * dVar57);
  dVar20 = (dVar19 - (dVar23 - (dVar23 - dVar19))) + (dVar29 - (dVar23 - dVar19));
  dVar36 = (dVar46 - (dVar25 - (dVar25 - dVar46))) + (dVar26 - (dVar25 - dVar46));
  dVar29 = dVar37 + dVar20;
  dVar23 = dVar22 + dVar29;
  dVar26 = (dVar22 - (dVar23 - (dVar23 - dVar22))) + (dVar29 - (dVar23 - dVar22));
  dVar22 = dVar27 + dVar23;
  dVar23 = (dVar27 - (dVar22 - (dVar22 - dVar27))) + (dVar23 - (dVar22 - dVar27));
  dVar19 = dVar36 + dVar26;
  dStack_d45b0 = (dVar37 - (dVar29 - dVar20)) + (dVar20 - (dVar29 - (dVar29 - dVar20)));
  dStack_d45a8 = (dVar26 - (dVar19 - (dVar19 - dVar26))) + (dVar36 - (dVar19 - dVar26));
  dVar29 = dStack_d5330 + dVar25;
  dVar26 = dVar23 + dVar19;
  dVar27 = dVar22 + dVar26;
  dVar22 = (dVar22 - (dVar27 - (dVar27 - dVar22))) + (dVar26 - (dVar27 - dVar22));
  dVar20 = (dStack_d5330 - (dVar29 - (dVar29 - dStack_d5330))) + (dVar25 - (dVar29 - dStack_d5330));
  dVar19 = (dVar23 - (dVar26 - (dVar26 - dVar23))) + (dVar19 - (dVar26 - dVar23));
  dVar26 = dVar19 + dVar20;
  dVar23 = dVar22 + dVar26;
  dVar22 = (dVar22 - (dVar23 - (dVar23 - dVar22))) + (dVar26 - (dVar23 - dVar22));
  dVar25 = dVar27 + dVar23;
  dVar27 = (dVar27 - (dVar25 - (dVar25 - dVar27))) + (dVar23 - (dVar25 - dVar27));
  dVar23 = dVar22 + dVar29;
  dStack_d45a0 = (dVar19 - (dVar26 - (dVar26 - dVar19))) + (dVar20 - (dVar26 - dVar19));
  dStack_d4598 = (dVar22 - (dVar23 - (dVar23 - dVar22))) + (dVar29 - (dVar23 - dVar22));
  dVar22 = dVar27 + dVar23;
  dStack_d4580 = dVar25 + dVar22;
  dStack_d4590 = (dVar27 - (dVar22 - (dVar22 - dVar27))) + (dVar23 - (dVar22 - dVar27));
  dStack_d4588 = (dVar25 - (dStack_d4580 - (dStack_d4580 - dVar25))) +
                 (dVar22 - (dStack_d4580 - dVar25));
  dVar23 = b_18 * dVar21;
  dVar25 = b_18 * dVar31;
  dStack_d4738 = dVar24 * dVar39 -
                 (((dVar23 - dVar33 * dVar30) - dVar24 * dVar30) - dVar33 * dVar39);
  dVar21 = b_12 * dVar21;
  dVar31 = b_12 * dVar31;
  dVar19 = dVar61 * dVar39 - (((dVar21 - dVar63 * dVar30) - dVar30 * dVar61) - dVar63 * dVar39);
  dVar20 = dVar61 * dVar44 - (((dVar31 - dVar63 * dVar32) - dVar32 * dVar61) - dVar63 * dVar44);
  dVar27 = dVar23 + dVar19;
  dVar29 = dVar25 + dVar20;
  dVar26 = dVar21 + dVar27;
  dVar22 = dVar27 - (dVar26 - dVar21);
  dVar36 = dVar24 * dVar44 - (((dVar25 - dVar33 * dVar32) - dVar32 * dVar24) - dVar33 * dVar44);
  dVar23 = (dVar23 - (dVar27 - (dVar27 - dVar23))) + (dVar19 - (dVar27 - dVar23));
  dVar21 = (dVar25 - (dVar29 - (dVar29 - dVar25))) + (dVar20 - (dVar29 - dVar25));
  dVar24 = dVar36 + dVar23;
  dVar25 = dVar22 + dVar24;
  dVar27 = (dVar22 - (dVar25 - (dVar25 - dVar22))) + (dVar24 - (dVar25 - dVar22));
  dVar22 = dVar26 + dVar25;
  dVar25 = (dVar26 - (dVar22 - (dVar22 - dVar26))) + (dVar25 - (dVar22 - dVar26));
  dVar19 = dVar21 + dVar27;
  dStack_d4730 = (dVar36 - (dVar24 - dVar23)) + (dVar23 - (dVar24 - (dVar24 - dVar23)));
  dStack_d4728 = (dVar27 - (dVar19 - (dVar19 - dVar27))) + (dVar21 - (dVar19 - dVar27));
  dVar26 = dVar31 + dVar29;
  dVar23 = dVar25 + dVar19;
  dVar24 = dVar22 + dVar23;
  dVar21 = (dVar22 - (dVar24 - (dVar24 - dVar22))) + (dVar23 - (dVar24 - dVar22));
  dVar22 = (dVar31 - (dVar26 - (dVar26 - dVar31))) + (dVar29 - (dVar26 - dVar31));
  dVar23 = (dVar25 - (dVar23 - (dVar23 - dVar25))) + (dVar19 - (dVar23 - dVar25));
  dVar29 = dVar23 + dVar22;
  dVar25 = dVar21 + dVar29;
  dVar21 = (dVar21 - (dVar25 - (dVar25 - dVar21))) + (dVar29 - (dVar25 - dVar21));
  dVar27 = dVar24 + dVar25;
  dVar25 = (dVar24 - (dVar27 - (dVar27 - dVar24))) + (dVar25 - (dVar27 - dVar24));
  dVar24 = dVar21 + dVar26;
  dStack_d4720 = (dVar23 - (dVar29 - (dVar29 - dVar23))) + (dVar22 - (dVar29 - dVar23));
  dStack_d4718 = (dVar21 - (dVar24 - (dVar24 - dVar21))) + (dVar26 - (dVar24 - dVar21));
  dVar22 = dVar25 + dVar24;
  dStack_d4700 = dVar27 + dVar22;
  dStack_d4710 = (dVar25 - (dVar22 - (dVar22 - dVar25))) + (dVar24 - (dVar22 - dVar25));
  dStack_d4708 = (dVar27 - (dStack_d4700 - (dStack_d4700 - dVar27))) +
                 (dVar22 - (dStack_d4700 - dVar27));
  iVar11 = fast_expansion_sum_zeroelim(8,&dStack_d45b8,8,&dStack_d4738,bd);
  dStack_d5458 = -b_00;
  iVar12 = scale_expansion_zeroelim(iVar8,cd,-b_00,temp32a);
  dStack_d5408 = -b_03;
  iVar13 = scale_expansion_zeroelim(iVar8,cd,-b_03,temp32b);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,temp32a,iVar13,temp32b,temp64a);
  iVar13 = scale_expansion_zeroelim(iVar11,bd,b_01,temp32a);
  iVar14 = scale_expansion_zeroelim(iVar11,bd,b_04,temp32b);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,temp32a,iVar14,temp32b,temp64b);
  dStack_d5358 = -b_02;
  iVar14 = scale_expansion_zeroelim(iVar7,bc,-b_02,temp32a);
  dStack_d5328 = -b_05;
  iVar15 = scale_expansion_zeroelim(iVar7,bc,-b_05,temp32b);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,temp32a,iVar15,temp32b,temp64c);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,temp64a,iVar13,temp64b,temp128);
  iVar12 = fast_expansion_sum_zeroelim(iVar14,temp64c,iVar12,temp128,temp192);
  iVar13 = scale_expansion_zeroelim(iVar12,temp192,b_07,detx);
  iVar13 = scale_expansion_zeroelim(iVar13,detx,b_07,detxx);
  iVar14 = scale_expansion_zeroelim(iVar12,temp192,b_13,detxt);
  uVar16 = scale_expansion_zeroelim(iVar14,detxt,b_07,detxxt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detxxt[uVar17] = detxxt[uVar17] + detxxt[uVar17];
  }
  iVar14 = scale_expansion_zeroelim(iVar14,detxt,b_13,detxtxt);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,detxx,uVar16,detxxt,x1);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,x1,iVar14,detxtxt,x2);
  iVar14 = scale_expansion_zeroelim(iVar12,temp192,b_10,dety);
  iVar14 = scale_expansion_zeroelim(iVar14,dety,b_10,detyy);
  iVar15 = scale_expansion_zeroelim(iVar12,temp192,b_17,detyt);
  uVar16 = scale_expansion_zeroelim(iVar15,detyt,b_10,detyyt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detyyt[uVar17] = detyyt[uVar17] + detyyt[uVar17];
  }
  dVar22 = ((dVar1 - b) - dVar2) + (dVar1 - (b + (dVar1 - b)));
  iVar15 = scale_expansion_zeroelim(iVar15,detyt,b_17,detytyt);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,detyy,uVar16,detyyt,y1);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,y1,iVar15,detytyt,y2);
  iVar15 = scale_expansion_zeroelim(iVar12,temp192,b,detz);
  iVar15 = scale_expansion_zeroelim(iVar15,detz,b,detzz);
  iVar12 = scale_expansion_zeroelim(iVar12,temp192,dVar22,detzt);
  uVar16 = scale_expansion_zeroelim(iVar12,detzt,b,detzzt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detzzt[uVar17] = detzzt[uVar17] + detzzt[uVar17];
  }
  iVar12 = scale_expansion_zeroelim(iVar12,detzt,dVar22,detztzt);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,detzz,uVar16,detzzt,z1);
  iVar12 = fast_expansion_sum_zeroelim(iVar15,z1,iVar12,detztzt,z2);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,x2,iVar14,y2,detxy);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,z2,iVar13,detxy,adet);
  iVar13 = scale_expansion_zeroelim(iVar9,da,b_01,temp32a);
  iVar14 = scale_expansion_zeroelim(iVar9,da,b_04,temp32b);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,temp32a,iVar14,temp32b,temp64a);
  iVar14 = scale_expansion_zeroelim(iVar10,ac,b_02,temp32a);
  iVar15 = scale_expansion_zeroelim(iVar10,ac,b_05,temp32b);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,temp32a,iVar15,temp32b,temp64b);
  iVar15 = scale_expansion_zeroelim(iVar8,cd,b,temp32a);
  iVar8 = scale_expansion_zeroelim(iVar8,cd,dVar22,temp32b);
  iVar8 = fast_expansion_sum_zeroelim(iVar15,temp32a,iVar8,temp32b,temp64c);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,temp64a,iVar14,temp64b,temp128);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,temp64c,iVar13,temp128,temp192);
  iVar13 = scale_expansion_zeroelim(iVar8,temp192,b_21,detx);
  iVar13 = scale_expansion_zeroelim(iVar13,detx,b_21,detxx);
  iVar14 = scale_expansion_zeroelim(iVar8,temp192,b_20,detxt);
  uVar16 = scale_expansion_zeroelim(iVar14,detxt,b_21,detxxt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detxxt[uVar17] = detxxt[uVar17] + detxxt[uVar17];
  }
  iVar14 = scale_expansion_zeroelim(iVar14,detxt,b_20,detxtxt);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,detxx,uVar16,detxxt,x1);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,x1,iVar14,detxtxt,x2);
  iVar14 = scale_expansion_zeroelim(iVar8,temp192,b_14,dety);
  iVar14 = scale_expansion_zeroelim(iVar14,dety,b_14,detyy);
  iVar15 = scale_expansion_zeroelim(iVar8,temp192,b_19,detyt);
  uVar16 = scale_expansion_zeroelim(iVar15,detyt,b_14,detyyt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detyyt[uVar17] = detyyt[uVar17] + detyyt[uVar17];
  }
  iVar15 = scale_expansion_zeroelim(iVar15,detyt,b_19,detytyt);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,detyy,uVar16,detyyt,y1);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,y1,iVar15,detytyt,y2);
  iVar15 = scale_expansion_zeroelim(iVar8,temp192,b_00,detz);
  iVar15 = scale_expansion_zeroelim(iVar15,detz,b_00,detzz);
  iVar8 = scale_expansion_zeroelim(iVar8,temp192,b_03,detzt);
  uVar16 = scale_expansion_zeroelim(iVar8,detzt,b_00,detzzt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detzzt[uVar17] = detzzt[uVar17] + detzzt[uVar17];
  }
  iVar8 = scale_expansion_zeroelim(iVar8,detzt,b_03,detztzt);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,detzz,uVar16,detzzt,z1);
  iVar8 = fast_expansion_sum_zeroelim(iVar15,z1,iVar8,detztzt,z2);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,x2,iVar14,y2,detxy);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,z2,iVar13,detxy,bdet);
  iVar13 = scale_expansion_zeroelim(iVar6,ab,dStack_d5358,temp32a);
  iVar14 = scale_expansion_zeroelim(iVar6,ab,dStack_d5328,temp32b);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,temp32a,iVar14,temp32b,temp64a);
  iVar14 = scale_expansion_zeroelim(iVar11,bd,-b,temp32a);
  iVar11 = scale_expansion_zeroelim(iVar11,bd,-dVar22,temp32b);
  iVar11 = fast_expansion_sum_zeroelim(iVar14,temp32a,iVar11,temp32b,temp64b);
  iVar14 = scale_expansion_zeroelim(iVar9,da,dStack_d5458,temp32a);
  iVar9 = scale_expansion_zeroelim(iVar9,da,dStack_d5408,temp32b);
  iVar9 = fast_expansion_sum_zeroelim(iVar14,temp32a,iVar9,temp32b,temp64c);
  iVar11 = fast_expansion_sum_zeroelim(iVar13,temp64a,iVar11,temp64b,temp128);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,temp64c,iVar11,temp128,temp192);
  iVar11 = scale_expansion_zeroelim(iVar9,temp192,b_08,detx);
  iVar11 = scale_expansion_zeroelim(iVar11,detx,b_08,detxx);
  iVar13 = scale_expansion_zeroelim(iVar9,temp192,b_15,detxt);
  uVar16 = scale_expansion_zeroelim(iVar13,detxt,b_08,detxxt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detxxt[uVar17] = detxxt[uVar17] + detxxt[uVar17];
  }
  iVar13 = scale_expansion_zeroelim(iVar13,detxt,b_15,detxtxt);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,detxx,uVar16,detxxt,x1);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,x1,iVar13,detxtxt,x2);
  iVar13 = scale_expansion_zeroelim(iVar9,temp192,b_09,dety);
  iVar13 = scale_expansion_zeroelim(iVar13,dety,b_09,detyy);
  iVar14 = scale_expansion_zeroelim(iVar9,temp192,b_16,detyt);
  uVar16 = scale_expansion_zeroelim(iVar14,detyt,b_09,detyyt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detyyt[uVar17] = detyyt[uVar17] + detyyt[uVar17];
  }
  iVar14 = scale_expansion_zeroelim(iVar14,detyt,b_16,detytyt);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,detyy,uVar16,detyyt,y1);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,y1,iVar14,detytyt,y2);
  iVar14 = scale_expansion_zeroelim(iVar9,temp192,b_01,detz);
  iVar14 = scale_expansion_zeroelim(iVar14,detz,b_01,detzz);
  iVar9 = scale_expansion_zeroelim(iVar9,temp192,b_04,detzt);
  uVar16 = scale_expansion_zeroelim(iVar9,detzt,b_01,detzzt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detzzt[uVar17] = detzzt[uVar17] + detzzt[uVar17];
  }
  iVar9 = scale_expansion_zeroelim(iVar9,detzt,b_04,detztzt);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,detzz,uVar16,detzzt,z1);
  iVar9 = fast_expansion_sum_zeroelim(iVar14,z1,iVar9,detztzt,z2);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,x2,iVar13,y2,detxy);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,z2,iVar11,detxy,cdet);
  iVar11 = scale_expansion_zeroelim(iVar7,bc,b,temp32a);
  iVar7 = scale_expansion_zeroelim(iVar7,bc,dVar22,temp32b);
  iVar7 = fast_expansion_sum_zeroelim(iVar11,temp32a,iVar7,temp32b,temp64a);
  iVar11 = scale_expansion_zeroelim(iVar10,ac,dStack_d5458,temp32a);
  iVar10 = scale_expansion_zeroelim(iVar10,ac,dStack_d5408,temp32b);
  iVar10 = fast_expansion_sum_zeroelim(iVar11,temp32a,iVar10,temp32b,temp64b);
  iVar11 = scale_expansion_zeroelim(iVar6,ab,b_01,temp32a);
  iVar6 = scale_expansion_zeroelim(iVar6,ab,b_04,temp32b);
  iVar6 = fast_expansion_sum_zeroelim(iVar11,temp32a,iVar6,temp32b,temp64c);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,temp64a,iVar10,temp64b,temp128);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,temp64c,iVar7,temp128,temp192);
  iVar7 = scale_expansion_zeroelim(iVar6,temp192,b_12,detx);
  iVar7 = scale_expansion_zeroelim(iVar7,detx,b_12,detxx);
  iVar10 = scale_expansion_zeroelim(iVar6,temp192,b_18,detxt);
  uVar16 = scale_expansion_zeroelim(iVar10,detxt,b_12,detxxt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detxxt[uVar17] = detxxt[uVar17] + detxxt[uVar17];
  }
  iVar10 = scale_expansion_zeroelim(iVar10,detxt,b_18,detxtxt);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,detxx,uVar16,detxxt,x1);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,x1,iVar10,detxtxt,x2);
  iVar10 = scale_expansion_zeroelim(iVar6,temp192,b_06,dety);
  iVar10 = scale_expansion_zeroelim(iVar10,dety,b_06,detyy);
  iVar11 = scale_expansion_zeroelim(iVar6,temp192,b_11,detyt);
  uVar16 = scale_expansion_zeroelim(iVar11,detyt,b_06,detyyt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detyyt[uVar17] = detyyt[uVar17] + detyyt[uVar17];
  }
  iVar11 = scale_expansion_zeroelim(iVar11,detyt,b_11,detytyt);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,detyy,uVar16,detyyt,y1);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,y1,iVar11,detytyt,y2);
  iVar11 = scale_expansion_zeroelim(iVar6,temp192,b_02,detz);
  iVar11 = scale_expansion_zeroelim(iVar11,detz,b_02,detzz);
  iVar6 = scale_expansion_zeroelim(iVar6,temp192,b_05,detzt);
  uVar16 = scale_expansion_zeroelim(iVar6,detzt,b_02,detzzt);
  uVar17 = 0;
  uVar18 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar18 = 0;
  }
  for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
    detzzt[uVar17] = detzzt[uVar17] + detzzt[uVar17];
  }
  iVar6 = scale_expansion_zeroelim(iVar6,detzt,b_05,detztzt);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,detzz,uVar16,detzzt,z1);
  iVar6 = fast_expansion_sum_zeroelim(iVar11,z1,iVar6,detztzt,z2);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,x2,iVar10,y2,detxy);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,z2,iVar7,detxy,ddet);
  iVar7 = fast_expansion_sum_zeroelim(iVar12,adet,iVar8,bdet,abdet);
  iVar6 = fast_expansion_sum_zeroelim(iVar9,cdet,iVar6,ddet,cddet);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,abdet,iVar6,cddet,deter);
  return ddet[(long)iVar6 + 0x1aff];
}

Assistant:

REAL insphereslow(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, cxdy7, dxay7, axcy7, bxdy7;
  INEXACT REAL bxay7, cxby7, dxcy7, axdy7, cxay7, dxby7;
  REAL axby[8], bxcy[8], cxdy[8], dxay[8], axcy[8], bxdy[8];
  REAL bxay[8], cxby[8], dxcy[8], axdy[8], cxay[8], dxby[8];
  REAL ab[16], bc[16], cd[16], da[16], ac[16], bd[16];
  int ablen, bclen, cdlen, dalen, aclen, bdlen;
  REAL temp32a[32], temp32b[32], temp64a[64], temp64b[64], temp64c[64];
  int temp32alen, temp32blen, temp64alen, temp64blen, temp64clen;
  REAL temp128[128], temp192[192];
  int temp128len, temp192len;
  REAL detx[384], detxx[768], detxt[384], detxxt[768], detxtxt[768];
  int xlen, xxlen, xtlen, xxtlen, xtxtlen;
  REAL x1[1536], x2[2304];
  int x1len, x2len;
  REAL dety[384], detyy[768], detyt[384], detyyt[768], detytyt[768];
  int ylen, yylen, ytlen, yytlen, ytytlen;
  REAL y1[1536], y2[2304];
  int y1len, y2len;
  REAL detz[384], detzz[768], detzt[384], detzzt[768], detztzt[768];
  int zlen, zzlen, ztlen, zztlen, ztztlen;
  REAL z1[1536], z2[2304];
  int z1len, z2len;
  REAL detxy[4608];
  int xylen;
  REAL adet[6912], bdet[6912], cdet[6912], ddet[6912];
  int alen, blen, clen, dlen;
  REAL abdet[13824], cddet[13824], deter[27648];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pe[0], aex, aextail);
  Two_Diff(pa[1], pe[1], aey, aeytail);
  Two_Diff(pa[2], pe[2], aez, aeztail);
  Two_Diff(pb[0], pe[0], bex, bextail);
  Two_Diff(pb[1], pe[1], bey, beytail);
  Two_Diff(pb[2], pe[2], bez, beztail);
  Two_Diff(pc[0], pe[0], cex, cextail);
  Two_Diff(pc[1], pe[1], cey, ceytail);
  Two_Diff(pc[2], pe[2], cez, ceztail);
  Two_Diff(pd[0], pe[0], dex, dextail);
  Two_Diff(pd[1], pe[1], dey, deytail);
  Two_Diff(pd[2], pe[2], dez, deztail);

  Two_Two_Product(aex, aextail, bey, beytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -aey;
  negatetail = -aeytail;
  Two_Two_Product(bex, bextail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  ablen = fast_expansion_sum_zeroelim(8, axby, 8, bxay, ab);
  Two_Two_Product(bex, bextail, cey, ceytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bey;
  negatetail = -beytail;
  Two_Two_Product(cex, cextail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  bclen = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, bc);
  Two_Two_Product(cex, cextail, dey, deytail,
                  cxdy7, cxdy[6], cxdy[5], cxdy[4],
                  cxdy[3], cxdy[2], cxdy[1], cxdy[0]);
  cxdy[7] = cxdy7;
  negate = -cey;
  negatetail = -ceytail;
  Two_Two_Product(dex, dextail, negate, negatetail,
                  dxcy7, dxcy[6], dxcy[5], dxcy[4],
                  dxcy[3], dxcy[2], dxcy[1], dxcy[0]);
  dxcy[7] = dxcy7;
  cdlen = fast_expansion_sum_zeroelim(8, cxdy, 8, dxcy, cd);
  Two_Two_Product(dex, dextail, aey, aeytail,
                  dxay7, dxay[6], dxay[5], dxay[4],
                  dxay[3], dxay[2], dxay[1], dxay[0]);
  dxay[7] = dxay7;
  negate = -dey;
  negatetail = -deytail;
  Two_Two_Product(aex, aextail, negate, negatetail,
                  axdy7, axdy[6], axdy[5], axdy[4],
                  axdy[3], axdy[2], axdy[1], axdy[0]);
  axdy[7] = axdy7;
  dalen = fast_expansion_sum_zeroelim(8, dxay, 8, axdy, da);
  Two_Two_Product(aex, aextail, cey, ceytail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;
  negate = -aey;
  negatetail = -aeytail;
  Two_Two_Product(cex, cextail, negate, negatetail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  aclen = fast_expansion_sum_zeroelim(8, axcy, 8, cxay, ac);
  Two_Two_Product(bex, bextail, dey, deytail,
                  bxdy7, bxdy[6], bxdy[5], bxdy[4],
                  bxdy[3], bxdy[2], bxdy[1], bxdy[0]);
  bxdy[7] = bxdy7;
  negate = -bey;
  negatetail = -beytail;
  Two_Two_Product(dex, dextail, negate, negatetail,
                  dxby7, dxby[6], dxby[5], dxby[4],
                  dxby[3], dxby[2], dxby[1], dxby[0]);
  dxby[7] = dxby7;
  bdlen = fast_expansion_sum_zeroelim(8, bxdy, 8, dxby, bd);

  temp32alen = scale_expansion_zeroelim(cdlen, cd, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(cdlen, cd, -beztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(bdlen, bd, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(bdlen, bd, ceztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(bclen, bc, -dez, temp32a);
  temp32blen = scale_expansion_zeroelim(bclen, bc, -deztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, aex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, aex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, aextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, aex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, aextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, aey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, aey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, aeytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, aey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, aeytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, aez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, aez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, aeztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, aez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, aeztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  alen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, adet);

  temp32alen = scale_expansion_zeroelim(dalen, da, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(dalen, da, ceztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(aclen, ac, dez, temp32a);
  temp32blen = scale_expansion_zeroelim(aclen, ac, deztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(cdlen, cd, aez, temp32a);
  temp32blen = scale_expansion_zeroelim(cdlen, cd, aeztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, bex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, bex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, bextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, bex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, bextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, bey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, bey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, beytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, bey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, beytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, bez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, bez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, beztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, bez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, beztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  blen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, bdet);

  temp32alen = scale_expansion_zeroelim(ablen, ab, -dez, temp32a);
  temp32blen = scale_expansion_zeroelim(ablen, ab, -deztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(bdlen, bd, -aez, temp32a);
  temp32blen = scale_expansion_zeroelim(bdlen, bd, -aeztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(dalen, da, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(dalen, da, -beztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, cex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, cex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, cextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, cex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, cextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, cey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, cey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, ceytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, cey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, ceytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, cez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, cez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, ceztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, cez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, ceztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  clen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, cdet);

  temp32alen = scale_expansion_zeroelim(bclen, bc, aez, temp32a);
  temp32blen = scale_expansion_zeroelim(bclen, bc, aeztail, temp32b);
  temp64alen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64a);
  temp32alen = scale_expansion_zeroelim(aclen, ac, -bez, temp32a);
  temp32blen = scale_expansion_zeroelim(aclen, ac, -beztail, temp32b);
  temp64blen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64b);
  temp32alen = scale_expansion_zeroelim(ablen, ab, cez, temp32a);
  temp32blen = scale_expansion_zeroelim(ablen, ab, ceztail, temp32b);
  temp64clen = fast_expansion_sum_zeroelim(temp32alen, temp32a,
                                           temp32blen, temp32b, temp64c);
  temp128len = fast_expansion_sum_zeroelim(temp64alen, temp64a,
                                           temp64blen, temp64b, temp128);
  temp192len = fast_expansion_sum_zeroelim(temp64clen, temp64c,
                                           temp128len, temp128, temp192);
  xlen = scale_expansion_zeroelim(temp192len, temp192, dex, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, dex, detxx);
  xtlen = scale_expansion_zeroelim(temp192len, temp192, dextail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, dex, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, dextail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);
  ylen = scale_expansion_zeroelim(temp192len, temp192, dey, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, dey, detyy);
  ytlen = scale_expansion_zeroelim(temp192len, temp192, deytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, dey, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, deytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);
  zlen = scale_expansion_zeroelim(temp192len, temp192, dez, detz);
  zzlen = scale_expansion_zeroelim(zlen, detz, dez, detzz);
  ztlen = scale_expansion_zeroelim(temp192len, temp192, deztail, detzt);
  zztlen = scale_expansion_zeroelim(ztlen, detzt, dez, detzzt);
  for (i = 0; i < zztlen; i++) {
    detzzt[i] *= 2.0;
  }
  ztztlen = scale_expansion_zeroelim(ztlen, detzt, deztail, detztzt);
  z1len = fast_expansion_sum_zeroelim(zzlen, detzz, zztlen, detzzt, z1);
  z2len = fast_expansion_sum_zeroelim(z1len, z1, ztztlen, detztzt, z2);
  xylen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, detxy);
  dlen = fast_expansion_sum_zeroelim(z2len, z2, xylen, detxy, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}